

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O3

void test_bson_as_json_x1000(void)

{
  char cVar1;
  undefined8 uVar2;
  time_t tVar3;
  ulong uVar4;
  undefined8 uVar5;
  long *plVar6;
  long *__s1;
  int iVar7;
  undefined8 unaff_R14;
  long *unaff_R15;
  size_t len;
  bson_oid_t oid;
  bson_decimal128_t decimal128;
  undefined1 auStack_108 [8];
  undefined8 uStack_100;
  long *plStack_f8;
  code *pcStack_f0;
  long lStack_e0;
  undefined8 uStack_d8;
  long *plStack_d0;
  code *pcStack_c8;
  long lStack_b8;
  undefined8 uStack_b0;
  long *plStack_a8;
  code *pcStack_a0;
  long lStack_90;
  undefined8 uStack_88;
  long *plStack_80;
  long alStack_70 [3];
  undefined8 uStack_58;
  code *pcStack_50;
  undefined4 local_48;
  undefined1 local_44;
  undefined1 local_3c [12];
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = 0x3040000000000000;
  local_30 = 0xb;
  pcStack_50 = (code *)0x12c445;
  bson_oid_init_from_string(local_3c,"123412341234abcdabcdabcd");
  pcStack_50 = (code *)0x12c44a;
  uVar2 = bson_new();
  pcStack_50 = (code *)0x12c46e;
  cVar1 = bson_append_utf8(uVar2,"utf8",0xffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_50 = (code *)0x12c772;
    test_bson_as_json_x1000_cold_1();
LAB_0012c772:
    pcStack_50 = (code *)0x12c777;
    test_bson_as_json_x1000_cold_2();
LAB_0012c777:
    pcStack_50 = (code *)0x12c77c;
    test_bson_as_json_x1000_cold_3();
LAB_0012c77c:
    pcStack_50 = (code *)0x12c781;
    test_bson_as_json_x1000_cold_4();
LAB_0012c781:
    pcStack_50 = (code *)0x12c786;
    test_bson_as_json_x1000_cold_5();
LAB_0012c786:
    pcStack_50 = (code *)0x12c78b;
    test_bson_as_json_x1000_cold_6();
LAB_0012c78b:
    pcStack_50 = (code *)0x12c790;
    test_bson_as_json_x1000_cold_7();
LAB_0012c790:
    pcStack_50 = (code *)0x12c795;
    test_bson_as_json_x1000_cold_8();
LAB_0012c795:
    pcStack_50 = (code *)0x12c79a;
    test_bson_as_json_x1000_cold_9();
LAB_0012c79a:
    pcStack_50 = (code *)0x12c79f;
    test_bson_as_json_x1000_cold_10();
LAB_0012c79f:
    pcStack_50 = (code *)0x12c7a4;
    test_bson_as_json_x1000_cold_11();
LAB_0012c7a4:
    pcStack_50 = (code *)0x12c7a9;
    test_bson_as_json_x1000_cold_12();
LAB_0012c7a9:
    pcStack_50 = (code *)0x12c7ae;
    test_bson_as_json_x1000_cold_13();
LAB_0012c7ae:
    pcStack_50 = (code *)0x12c7b3;
    test_bson_as_json_x1000_cold_14();
LAB_0012c7b3:
    pcStack_50 = (code *)0x12c7b8;
    test_bson_as_json_x1000_cold_15();
LAB_0012c7b8:
    pcStack_50 = (code *)0x12c7bd;
    test_bson_as_json_x1000_cold_16();
LAB_0012c7bd:
    pcStack_50 = (code *)0x12c7c2;
    test_bson_as_json_x1000_cold_17();
LAB_0012c7c2:
    pcStack_50 = (code *)0x12c7c7;
    test_bson_as_json_x1000_cold_18();
LAB_0012c7c7:
    pcStack_50 = (code *)0x12c7cc;
    test_bson_as_json_x1000_cold_19();
LAB_0012c7cc:
    pcStack_50 = (code *)0x12c7d1;
    test_bson_as_json_x1000_cold_20();
  }
  else {
    pcStack_50 = (code *)0x12c48f;
    cVar1 = bson_append_int32(uVar2,"int32",0xffffffff,0x4d2);
    if (cVar1 == '\0') goto LAB_0012c772;
    pcStack_50 = (code *)0x12c4b0;
    cVar1 = bson_append_int64(uVar2,"int64",0xffffffff,0x10e1);
    if (cVar1 == '\0') goto LAB_0012c777;
    pcStack_50 = (code *)0x12c4d4;
    cVar1 = bson_append_double(0x9999999a,uVar2,"double",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c77c;
    pcStack_50 = (code *)0x12c4f0;
    cVar1 = bson_append_undefined(uVar2,"undefined",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c781;
    pcStack_50 = (code *)0x12c50c;
    cVar1 = bson_append_null(uVar2,"null",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c786;
    pcStack_50 = (code *)0x12c52d;
    cVar1 = bson_append_oid(uVar2,"oid",0xffffffff,local_3c);
    if (cVar1 == '\0') goto LAB_0012c78b;
    pcStack_50 = (code *)0x12c54e;
    cVar1 = bson_append_bool(uVar2,"true",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_0012c790;
    pcStack_50 = (code *)0x12c56c;
    cVar1 = bson_append_bool(uVar2,"false",0xffffffff,0);
    if (cVar1 == '\0') goto LAB_0012c795;
    pcStack_50 = (code *)0x12c57b;
    tVar3 = time((time_t *)0x0);
    pcStack_50 = (code *)0x12c592;
    cVar1 = bson_append_time_t(uVar2,"date",0xffffffff,tVar3);
    if (cVar1 == '\0') goto LAB_0012c79a;
    pcStack_50 = (code *)0x12c5a1;
    uVar4 = time((time_t *)0x0);
    pcStack_50 = (code *)0x12c5bd;
    cVar1 = bson_append_timestamp(uVar2,"timestamp",0xffffffff,uVar4 & 0xffffffff,0x4d2);
    if (cVar1 == '\0') goto LAB_0012c79f;
    pcStack_50 = (code *)0x12c5e7;
    cVar1 = bson_append_regex(uVar2,"regex",0xffffffff,"^abcd","xi");
    if (cVar1 == '\0') goto LAB_0012c7a4;
    pcStack_50 = (code *)0x12c60f;
    cVar1 = bson_append_dbpointer(uVar2,"dbpointer",0xffffffff,"mycollection",local_3c);
    if (cVar1 == '\0') goto LAB_0012c7a9;
    pcStack_50 = (code *)0x12c62b;
    cVar1 = bson_append_minkey(uVar2,"minkey",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c7ae;
    pcStack_50 = (code *)0x12c647;
    cVar1 = bson_append_maxkey(uVar2,"maxkey",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c7b3;
    pcStack_50 = (code *)0x12c670;
    cVar1 = bson_append_symbol(uVar2,"symbol",0xffffffff,"var a = {};",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012c7b8;
    pcStack_50 = (code *)0x12c691;
    cVar1 = bson_append_decimal128(uVar2,"decimal128",0xffffffff,&local_30);
    if (cVar1 == '\0') goto LAB_0012c7bd;
    pcStack_50 = (code *)0x12c69e;
    unaff_R14 = bson_new();
    pcStack_50 = (code *)0x12c6ba;
    cVar1 = bson_append_int32(unaff_R14,"0",0xffffffff,0x3c);
    if (cVar1 == '\0') goto LAB_0012c7c2;
    pcStack_50 = (code *)0x12c6d9;
    cVar1 = bson_append_document(uVar2,"document",0xffffffff,unaff_R14);
    if (cVar1 == '\0') goto LAB_0012c7c7;
    pcStack_50 = (code *)0x12c6f8;
    cVar1 = bson_append_array(uVar2,"array",0xffffffff,unaff_R14);
    if (cVar1 == '\0') goto LAB_0012c7cc;
    local_44 = 4;
    local_48 = 0x3020100;
    pcStack_50 = (code *)0x12c72b;
    cVar1 = bson_append_binary(uVar2,"binary",0xffffffff,0,&local_48,5);
    if (cVar1 != '\0') {
      iVar7 = 1000;
      do {
        pcStack_50 = (code *)0x12c746;
        uVar5 = bson_as_json(uVar2,&local_48);
        pcStack_50 = (code *)0x12c74e;
        bson_free(uVar5);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      pcStack_50 = (code *)0x12c75a;
      bson_destroy(uVar2);
      pcStack_50 = (code *)0x12c762;
      bson_destroy(unaff_R14);
      return;
    }
  }
  pcStack_50 = test_bson_as_json_multi;
  test_bson_as_json_x1000_cold_21();
  plVar6 = alStack_70;
  __s1 = alStack_70;
  uStack_58 = uVar2;
  pcStack_50 = (code *)unaff_R14;
  uVar2 = bson_new();
  bson_oid_init_from_string(alStack_70,"57e193d7a9cc81b4027498b5");
  cVar1 = bson_append_oid(uVar2,"_id",0xffffffff,alStack_70);
  if (cVar1 == '\0') {
    test_bson_as_json_multi_cold_1();
LAB_0012cd89:
    test_bson_as_json_multi_cold_2();
LAB_0012cd8e:
    test_bson_as_json_multi_cold_3();
LAB_0012cd93:
    test_bson_as_json_multi_cold_4();
LAB_0012cd98:
    test_bson_as_json_multi_cold_5();
LAB_0012cd9d:
    test_bson_as_json_multi_cold_6();
LAB_0012cda2:
    test_bson_as_json_multi_cold_7();
LAB_0012cda7:
    test_bson_as_json_multi_cold_8();
LAB_0012cdac:
    test_bson_as_json_multi_cold_9();
LAB_0012cdb1:
    test_bson_as_json_multi_cold_10();
LAB_0012cdb6:
    test_bson_as_json_multi_cold_11();
LAB_0012cdbb:
    test_bson_as_json_multi_cold_12();
LAB_0012cdc0:
    test_bson_as_json_multi_cold_13();
LAB_0012cdc5:
    test_bson_as_json_multi_cold_14();
LAB_0012cdca:
    test_bson_as_json_multi_cold_15();
LAB_0012cdcf:
    test_bson_as_json_multi_cold_16();
LAB_0012cdd4:
    test_bson_as_json_multi_cold_17();
LAB_0012cdd9:
    test_bson_as_json_multi_cold_18();
LAB_0012cdde:
    test_bson_as_json_multi_cold_19();
LAB_0012cde3:
    test_bson_as_json_multi_cold_20();
LAB_0012cde8:
    test_bson_as_json_multi_cold_21();
LAB_0012cded:
    test_bson_as_json_multi_cold_22();
LAB_0012cdf2:
    test_bson_as_json_multi_cold_23();
LAB_0012cdf7:
    test_bson_as_json_multi_cold_24();
LAB_0012cdfc:
    __s1 = plVar6;
    test_bson_as_json_multi_cold_25();
LAB_0012ce01:
    test_bson_as_json_multi_cold_26();
LAB_0012ce06:
    test_bson_as_json_multi_cold_27();
LAB_0012ce0b:
    test_bson_as_json_multi_cold_28();
LAB_0012ce10:
    test_bson_as_json_multi_cold_29();
LAB_0012ce15:
    test_bson_as_json_multi_cold_30();
LAB_0012ce1a:
    test_bson_as_json_multi_cold_31();
LAB_0012ce1f:
    test_bson_as_json_multi_cold_32();
LAB_0012ce24:
    test_bson_as_json_multi_cold_33();
LAB_0012ce29:
    test_bson_as_json_multi_cold_34();
LAB_0012ce2e:
    test_bson_as_json_multi_cold_35();
  }
  else {
    cVar1 = bson_append_symbol(uVar2,"Symbol",0xffffffff,"symbol",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012cd89;
    cVar1 = bson_append_utf8(uVar2,"String",0xffffffff,"string",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012cd8e;
    cVar1 = bson_append_int32(uVar2,"Int32",0xffffffff,0x2a);
    if (cVar1 == '\0') goto LAB_0012cd93;
    cVar1 = bson_append_int64(uVar2,"Int64",0xffffffff,0x2a);
    if (cVar1 == '\0') goto LAB_0012cd98;
    cVar1 = bson_append_double(0,uVar2,"Double",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012cd9d;
    alStack_70[0] = -0x3712543c08c7b35d;
    alStack_70[1] = 0xb68dab92a91478a3;
    cVar1 = bson_append_binary(uVar2,"Binary",0xffffffff,3,alStack_70,0x10);
    if (cVar1 == '\0') goto LAB_0012cda2;
    alStack_70[0] = CONCAT35(alStack_70[0]._5_3_,0x500000000);
    alStack_70[0] = CONCAT44(alStack_70[0]._4_4_,0x4030201);
    cVar1 = bson_append_binary(uVar2,"BinaryUserDefined",0xffffffff,0x80,alStack_70,5);
    if (cVar1 == '\0') goto LAB_0012cda7;
    cVar1 = bson_append_code(uVar2,"Code",0xffffffff,"function() {}");
    if (cVar1 == '\0') goto LAB_0012cdac;
    plVar6 = (long *)bson_new();
    cVar1 = bson_append_code_with_scope(uVar2,"CodeWithScope",0xffffffff,"function() {}",plVar6);
    if (cVar1 == '\0') goto LAB_0012cdb1;
    bson_destroy(plVar6);
    plVar6 = (long *)bson_new();
    cVar1 = bson_append_utf8(plVar6,"foo",0xffffffff,"bar",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012cdb6;
    cVar1 = bson_append_document(uVar2,"Subdocument",0xffffffff,plVar6);
    if (cVar1 == '\0') goto LAB_0012cdbb;
    bson_destroy(plVar6);
    plVar6 = (long *)bson_new();
    cVar1 = bson_append_int32(plVar6,"0",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_0012cdc0;
    cVar1 = bson_append_int32(plVar6,"1",0xffffffff,2);
    if (cVar1 == '\0') goto LAB_0012cdc5;
    cVar1 = bson_append_int32(plVar6,"2",0xffffffff,3);
    if (cVar1 == '\0') goto LAB_0012cdca;
    cVar1 = bson_append_int32(plVar6,"3",0xffffffff,4);
    if (cVar1 == '\0') goto LAB_0012cdcf;
    cVar1 = bson_append_int32(plVar6,"4",0xffffffff,5);
    if (cVar1 == '\0') goto LAB_0012cdd4;
    cVar1 = bson_append_array(uVar2,"Array",0xffffffff,plVar6);
    if (cVar1 == '\0') goto LAB_0012cdd9;
    bson_destroy(plVar6);
    cVar1 = bson_append_timestamp(uVar2,"Timestamp",0xffffffff,0x2a,1);
    if (cVar1 == '\0') goto LAB_0012cdde;
    cVar1 = bson_append_regex(uVar2,"Regex",0xffffffff,"pattern","");
    if (cVar1 == '\0') goto LAB_0012cde3;
    cVar1 = bson_append_date_time(uVar2,"DatetimeEpoch",0xffffffff,0);
    if (cVar1 == '\0') goto LAB_0012cde8;
    cVar1 = bson_append_date_time(uVar2,"DatetimePositive",0xffffffff,0x7fffffff);
    if (cVar1 == '\0') goto LAB_0012cded;
    cVar1 = bson_append_date_time(uVar2,"DatetimeNegative",0xffffffff,0xffffffff80000000);
    if (cVar1 == '\0') goto LAB_0012cdf2;
    cVar1 = bson_append_bool(uVar2,"True",0xffffffff,1);
    if (cVar1 == '\0') goto LAB_0012cdf7;
    cVar1 = bson_append_bool(uVar2,"False",0xffffffff,0);
    if (cVar1 == '\0') goto LAB_0012cdfc;
    bson_oid_init_from_string(alStack_70,"57e193d7a9cc81b4027498b1");
    cVar1 = bson_append_dbpointer(uVar2,"DBPointer",0xffffffff,"collection",alStack_70);
    if (cVar1 == '\0') goto LAB_0012ce01;
    __s1 = (long *)bson_new();
    bson_oid_init_from_string(alStack_70,"57fd71e96e32ab4225b723fb");
    cVar1 = bson_append_utf8(__s1,"$ref",0xffffffff,"collection",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce06;
    cVar1 = bson_append_oid(__s1,"$id",0xffffffff,alStack_70);
    if (cVar1 == '\0') goto LAB_0012ce0b;
    cVar1 = bson_append_utf8(__s1,"$db",0xffffffff,"database",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce10;
    cVar1 = bson_append_document(uVar2,"DBRef",0xffffffff,__s1);
    if (cVar1 == '\0') goto LAB_0012ce15;
    bson_destroy(__s1);
    cVar1 = bson_append_minkey(uVar2,"Minkey",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce1a;
    cVar1 = bson_append_maxkey(uVar2,"Maxkey",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce1f;
    cVar1 = bson_append_null(uVar2,"Null",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce24;
    cVar1 = bson_append_undefined(uVar2,"Undefined",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce29;
    alStack_70[1] = 0x3040000000000000;
    alStack_70[0] = 0xb;
    cVar1 = bson_append_decimal128(uVar2,"Decimal128",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012ce2e;
    __s1 = (long *)bson_as_json(uVar2,alStack_70);
    if (__s1 == (long *)
                "{ \"_id\" : { \"$oid\" : \"57e193d7a9cc81b4027498b5\" }, \"Symbol\" : \"symbol\", \"String\" : \"string\", \"Int32\" : 42, \"Int64\" : 42, \"Double\" : -1.0, \"Binary\" : { \"$binary\" : \"o0w498Or7cijeBSpkquNtg==\", \"$type\" : \"03\" }, \"BinaryUserDefined\" : { \"$binary\" : \"AQIDBAU=\", \"$type\" : \"80\" }, \"Code\" : { \"$code\" : \"function() {}\" }, \"CodeWithScope\" : { \"$code\" : \"function() {}\", \"$scope\" : { } }, \"Subdocument\" : { \"foo\" : \"bar\" }, \"Array\" : [ 1, 2, 3, 4, 5 ], \"Timestamp\" : { \"$timestamp\" : { \"t\" : 42, \"i\" : 1 } }, \"Regex\" : { \"$regex\" : \"pattern\", \"$options\" : \"\" }, \"DatetimeEpoch\" : { \"$date\" : 0 }, \"DatetimePositive\" : { \"$date\" : 2147483647 }, \"DatetimeNegative\" : { \"$date\" : -2147483648 }, \"True\" : true, \"False\" : false, \"DBPointer\" : { \"$ref\" : \"collection\", \"$id\" : \"57e193d7a9cc81b4027498b1\" }, \"DBRef\" : { \"$ref\" : \"collection\", \"$id\" : { \"$oid\" : \"57fd71e96e32ab4225b723fb\" }, \"$db\" : \"database\" }, \"Minkey\" : { \"$minKey\" : 1 }, \"Maxkey\" : { \"$maxKey\" : 1 }, \"Null\" : null, \"Undefined\" : { \"$undefined\" : true }, \"Decimal128\" : { \"$numberDecimal\" : \"11\" } }"
       ) {
LAB_0012cd6c:
      bson_free(__s1);
      bson_destroy(uVar2);
      return;
    }
    iVar7 = strcmp((char *)__s1,
                   "{ \"_id\" : { \"$oid\" : \"57e193d7a9cc81b4027498b5\" }, \"Symbol\" : \"symbol\", \"String\" : \"string\", \"Int32\" : 42, \"Int64\" : 42, \"Double\" : -1.0, \"Binary\" : { \"$binary\" : \"o0w498Or7cijeBSpkquNtg==\", \"$type\" : \"03\" }, \"BinaryUserDefined\" : { \"$binary\" : \"AQIDBAU=\", \"$type\" : \"80\" }, \"Code\" : { \"$code\" : \"function() {}\" }, \"CodeWithScope\" : { \"$code\" : \"function() {}\", \"$scope\" : { } }, \"Subdocument\" : { \"foo\" : \"bar\" }, \"Array\" : [ 1, 2, 3, 4, 5 ], \"Timestamp\" : { \"$timestamp\" : { \"t\" : 42, \"i\" : 1 } }, \"Regex\" : { \"$regex\" : \"pattern\", \"$options\" : \"\" }, \"DatetimeEpoch\" : { \"$date\" : 0 }, \"DatetimePositive\" : { \"$date\" : 2147483647 }, \"DatetimeNegative\" : { \"$date\" : -2147483648 }, \"True\" : true, \"False\" : false, \"DBPointer\" : { \"$ref\" : \"collection\", \"$id\" : \"57e193d7a9cc81b4027498b1\" }, \"DBRef\" : { \"$ref\" : \"collection\", \"$id\" : { \"$oid\" : \"57fd71e96e32ab4225b723fb\" }, \"$db\" : \"database\" }, \"Minkey\" : { \"$minKey\" : 1 }, \"Maxkey\" : { \"$maxKey\" : 1 }, \"Null\" : null, \"Undefined\" : { \"$undefined\" : true }, \"Decimal128\" : { \"$numberDecimal\" : \"11\" } }"
                  );
    if (iVar7 == 0) goto LAB_0012cd6c;
  }
  test_bson_as_json_multi_cold_36();
  pcStack_a0 = (code *)0x12ce49;
  uStack_88 = uVar2;
  plStack_80 = __s1;
  uVar2 = bson_new();
  pcStack_a0 = (code *)0x12ce6d;
  cVar1 = bson_append_utf8(uVar2,"foo",0xffffffff,"bar",0xffffffff);
  if (cVar1 == '\0') {
    pcStack_a0 = (code *)0x12cebc;
    test_bson_as_json_string_cold_1();
LAB_0012cebc:
    pcStack_a0 = (code *)0x12cec1;
    test_bson_as_json_string_cold_2();
  }
  else {
    unaff_R15 = &lStack_90;
    pcStack_a0 = (code *)0x12ce81;
    plVar6 = (long *)bson_as_json(uVar2,unaff_R15);
    if (lStack_90 != 0x11) goto LAB_0012cebc;
    pcStack_a0 = (code *)0x12ce99;
    iVar7 = strcmp("{ \"foo\" : \"bar\" }",(char *)plVar6);
    __s1 = plVar6;
    if (iVar7 == 0) {
      pcStack_a0 = (code *)0x12cea5;
      bson_free(plVar6);
      pcStack_a0 = (code *)0x12cead;
      bson_destroy(uVar2);
      return;
    }
  }
  pcStack_a0 = test_bson_as_json_int32;
  test_bson_as_json_string_cold_3();
  pcStack_c8 = (code *)0x12ced4;
  uStack_b0 = uVar2;
  plStack_a8 = __s1;
  pcStack_a0 = (code *)unaff_R15;
  uVar2 = bson_new();
  pcStack_c8 = (code *)0x12cef0;
  cVar1 = bson_append_int32(uVar2,"foo",0xffffffff,0x4d2);
  if (cVar1 == '\0') {
    pcStack_c8 = (code *)0x12cf3f;
    test_bson_as_json_int32_cold_1();
LAB_0012cf3f:
    pcStack_c8 = (code *)0x12cf44;
    test_bson_as_json_int32_cold_2();
  }
  else {
    unaff_R15 = &lStack_b8;
    pcStack_c8 = (code *)0x12cf04;
    plVar6 = (long *)bson_as_json(uVar2,unaff_R15);
    if (lStack_b8 != 0x10) goto LAB_0012cf3f;
    pcStack_c8 = (code *)0x12cf1c;
    iVar7 = strcmp("{ \"foo\" : 1234 }",(char *)plVar6);
    __s1 = plVar6;
    if (iVar7 == 0) {
      pcStack_c8 = (code *)0x12cf28;
      bson_free(plVar6);
      pcStack_c8 = (code *)0x12cf30;
      bson_destroy(uVar2);
      return;
    }
  }
  pcStack_c8 = test_bson_as_json_int64;
  test_bson_as_json_int32_cold_3();
  pcStack_f0 = (code *)0x12cf57;
  uStack_d8 = uVar2;
  plStack_d0 = __s1;
  pcStack_c8 = (code *)unaff_R15;
  uVar2 = bson_new();
  pcStack_f0 = (code *)0x12cf78;
  cVar1 = bson_append_int64(uVar2,"foo",0xffffffff,0x4bc4ea0973c01f2);
  if (cVar1 == '\0') {
    pcStack_f0 = (code *)0x12cfc7;
    test_bson_as_json_int64_cold_1();
LAB_0012cfc7:
    pcStack_f0 = (code *)0x12cfcc;
    test_bson_as_json_int64_cold_2();
  }
  else {
    unaff_R15 = &lStack_e0;
    pcStack_f0 = (code *)0x12cf8c;
    plVar6 = (long *)bson_as_json(uVar2,unaff_R15);
    if (lStack_e0 != 0x1e) goto LAB_0012cfc7;
    pcStack_f0 = (code *)0x12cfa4;
    iVar7 = strcmp("{ \"foo\" : 341234123412341234 }",(char *)plVar6);
    __s1 = plVar6;
    if (iVar7 == 0) {
      pcStack_f0 = (code *)0x12cfb0;
      bson_free(plVar6);
      pcStack_f0 = (code *)0x12cfb8;
      bson_destroy(uVar2);
      return;
    }
  }
  pcStack_f0 = test_bson_as_json_double;
  test_bson_as_json_int64_cold_3();
  uStack_100 = uVar2;
  plStack_f8 = __s1;
  pcStack_f0 = (code *)unaff_R15;
  uVar2 = bson_new();
  cVar1 = bson_append_double(0,uVar2,"foo",0xffffffff);
  if (cVar1 == '\0') {
    test_bson_as_json_double_cold_1();
LAB_0012d0f6:
    test_bson_as_json_double_cold_2();
LAB_0012d0fb:
    test_bson_as_json_double_cold_3();
LAB_0012d100:
    test_bson_as_json_double_cold_4();
  }
  else {
    cVar1 = bson_append_double(0,uVar2,"bar",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d0f6;
    cVar1 = bson_append_double(0,uVar2,"baz",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d0fb;
    cVar1 = bson_append_double(0,uVar2,"quux",0xffffffff);
    if (cVar1 == '\0') goto LAB_0012d100;
    cVar1 = bson_append_double(0xa2879f2e,uVar2,"huge",0xffffffff);
    if (cVar1 != '\0') {
      __s1 = (long *)bson_as_json(uVar2,auStack_108);
      unaff_R15 = (long *)bson_strdup_printf(0xa2879f2e,
                                             "{ \"foo\" : 123.5, \"bar\" : 3.0, \"baz\" : -1.0, \"quux\" : 0.03125, \"huge\" : %.20g }"
                                            );
      if (__s1 == unaff_R15) {
LAB_0012d0cf:
        bson_free(unaff_R15);
        bson_free(__s1);
        bson_destroy(uVar2);
        return;
      }
      iVar7 = strcmp((char *)__s1,(char *)unaff_R15);
      if (iVar7 == 0) goto LAB_0012d0cf;
      goto LAB_0012d10a;
    }
  }
  test_bson_as_json_double_cold_5();
LAB_0012d10a:
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",__s1,unaff_R15);
  abort();
}

Assistant:

static void
test_bson_as_json_x1000 (void)
{
   bson_oid_t oid;
   bson_decimal128_t decimal128;
   bson_t *b;
   bson_t *b2;
   char *str;
   size_t len;
   int i;

   decimal128.high = 0x3040000000000000ULL;
   decimal128.low = 0x000000000000000B;
   bson_oid_init_from_string (&oid, "123412341234abcdabcdabcd");

   b = bson_new ();
   BSON_ASSERT (bson_append_utf8 (b, "utf8", -1, "bar", -1));
   BSON_ASSERT (bson_append_int32 (b, "int32", -1, 1234));
   BSON_ASSERT (bson_append_int64 (b, "int64", -1, 4321));
   BSON_ASSERT (bson_append_double (b, "double", -1, 123.4));
   BSON_ASSERT (bson_append_undefined (b, "undefined", -1));
   BSON_ASSERT (bson_append_null (b, "null", -1));
   BSON_ASSERT (bson_append_oid (b, "oid", -1, &oid));
   BSON_ASSERT (bson_append_bool (b, "true", -1, true));
   BSON_ASSERT (bson_append_bool (b, "false", -1, false));
   BSON_ASSERT (bson_append_time_t (b, "date", -1, time (NULL)));
   BSON_ASSERT (
      bson_append_timestamp (b, "timestamp", -1, (uint32_t) time (NULL), 1234));
   BSON_ASSERT (bson_append_regex (b, "regex", -1, "^abcd", "xi"));
   BSON_ASSERT (
      bson_append_dbpointer (b, "dbpointer", -1, "mycollection", &oid));
   BSON_ASSERT (bson_append_minkey (b, "minkey", -1));
   BSON_ASSERT (bson_append_maxkey (b, "maxkey", -1));
   BSON_ASSERT (bson_append_symbol (b, "symbol", -1, "var a = {};", -1));
   BSON_ASSERT (bson_append_decimal128 (b, "decimal128", -1, &decimal128));

   b2 = bson_new ();
   BSON_ASSERT (bson_append_int32 (b2, "0", -1, 60));
   BSON_ASSERT (bson_append_document (b, "document", -1, b2));
   BSON_ASSERT (bson_append_array (b, "array", -1, b2));

   {
      const uint8_t binary[] = {0, 1, 2, 3, 4};
      BSON_ASSERT (bson_append_binary (
         b, "binary", -1, BSON_SUBTYPE_BINARY, binary, sizeof binary));
   }

   for (i = 0; i < 1000; i++) {
      str = bson_as_json (b, &len);
      bson_free (str);
   }

   bson_destroy (b);
   bson_destroy (b2);
}